

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::MaskConstancyCase::iterate(MaskConstancyCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  int i;
  int iVar3;
  deUint32 dVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_var;
  size_t sVar9;
  long lVar10;
  uint uVar11;
  Surface *surface;
  void *__buf;
  uint uVar12;
  bool *pbVar13;
  char *pcVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  bool *pbVar18;
  int iVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  Vec4 alpha0;
  Vec4 alpha1;
  Vector<float,_4> res_2;
  Vector<float,_4> res;
  Vec4 baseRed;
  Surface renderedImg;
  Vector<float,_4> res_1;
  Vec4 baseGreen;
  Vec2 local_2b8;
  Vec2 local_2b0;
  Vec2 local_2a8;
  Vec2 local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_298;
  DefaultFBOMultisampleCase *local_290;
  uint local_288;
  float local_284;
  float local_280;
  float local_27c;
  undefined1 local_278 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  float local_258 [4];
  Vec4 local_248;
  Vec4 local_238;
  Vec4 local_228;
  ulong local_218;
  string local_210;
  Surface local_1f0;
  Vec4 local_1d8;
  ulong local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [8];
  _func_int **pp_Stack_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  long lVar8;
  
  iVar3 = (*((this->super_DefaultFBOMultisampleCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((this->super_DefaultFBOMultisampleCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  iVar3 = (this->super_DefaultFBOMultisampleCase).m_viewportSize;
  tcu::Surface::Surface(&local_1f0,iVar3,iVar3);
  DefaultFBOMultisampleCase::randomizeViewport(&this->super_DefaultFBOMultisampleCase);
  local_1b0 = (undefined1  [8])paVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1a8,"Clearing color to black",0x17);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
  std::ios_base::~ios_base(local_138);
  (**(code **)(lVar8 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar8 + 0x188))(0x4000);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x2f5);
  if ((this->super_DefaultFBOMultisampleCase).field_0xb1 == '\x01') {
    (**(code **)(lVar8 + 0x5e0))(0x809e);
    (**(code **)(lVar8 + 0x238))(1,1,1,0);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"enable GL_SAMPLE_ALPHA_TO_COVERAGE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                    ,0x2fb);
    local_1b0 = (undefined1  [8])paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1a8,"GL_SAMPLE_ALPHA_TO_COVERAGE is enabled",0x26);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
    std::ios_base::~ios_base(local_138);
    local_1b0 = (undefined1  [8])paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1a8,"Color mask is TRUE, TRUE, TRUE, FALSE",0x25);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if ((this->super_DefaultFBOMultisampleCase).field_0xb2 == '\x01') {
    (**(code **)(lVar8 + 0x5e0))(0x80a0);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"enable GL_SAMPLE_COVERAGE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                    ,0x304);
    local_1b0 = (undefined1  [8])paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1a8,"GL_SAMPLE_COVERAGE is enabled",0x1d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if ((this->super_DefaultFBOMultisampleCase).field_0xb4 == '\x01') {
    (**(code **)(lVar8 + 0x5e0))(0x8e51);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"enable GL_SAMPLE_MASK",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                    ,0x30c);
    local_1b0 = (undefined1  [8])paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1a8,"GL_SAMPLE_MASK is enabled",0x19);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
    std::ios_base::~ios_base(local_138);
  }
  local_1b0 = (undefined1  [8])paVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1a8,
             "Drawing several green quads, each fully overlapped by a red quad with the same ",0x4f)
  ;
  uVar16 = (ulong)(byte)(this->super_DefaultFBOMultisampleCase).field_0xb1;
  pbVar18 = glcts::fixed_sample_locations_values + 1;
  pbVar13 = glcts::fixed_sample_locations_values + 1;
  if (uVar16 != 0) {
    pbVar13 = (bool *)0x1a60f13;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1a8,pbVar13,uVar16 * 5);
  if ((((this->super_DefaultFBOMultisampleCase).field_0xb1 == '\x01') &&
      (pbVar18 = (bool *)0x1c07d78, (this->super_DefaultFBOMultisampleCase).field_0xb2 == '\0')) &&
     (pbVar18 = glcts::fixed_sample_locations_values + 1,
     (this->super_DefaultFBOMultisampleCase).field_0xb4 != '\0')) {
    pbVar18 = (bool *)0x1c07d78;
  }
  sVar9 = strlen(pbVar18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1a8,pbVar18,sVar9);
  uVar16 = (ulong)(byte)(this->super_DefaultFBOMultisampleCase).field_0xb3;
  pcVar14 = "inverted ";
  if (uVar16 == 0) {
    pcVar14 = glcts::fixed_sample_locations_values + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1a8,pcVar14,uVar16 * 9);
  pbVar13 = (bool *)0x1ca38b4;
  bVar20 = (this->super_DefaultFBOMultisampleCase).field_0xb2 == '\0';
  if (bVar20) {
    pbVar13 = glcts::fixed_sample_locations_values + 1;
  }
  lVar10 = 0xf;
  if (bVar20) {
    lVar10 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1a8,pbVar13,lVar10);
  bVar2 = (this->super_DefaultFBOMultisampleCase).field_0xb4 &
          (this->super_DefaultFBOMultisampleCase).field_0xb2;
  pbVar13 = glcts::fixed_sample_locations_values + 1;
  if (bVar2 != 0) {
    pbVar13 = (bool *)0x1c07d78;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1a8,pbVar13,(ulong)bVar2 * 5);
  pcVar14 = "sample mask";
  bVar20 = (this->super_DefaultFBOMultisampleCase).field_0xb4 == '\0';
  if (bVar20) {
    pcVar14 = glcts::fixed_sample_locations_values + 1;
  }
  lVar10 = 0xb;
  if (bVar20) {
    lVar10 = 0;
  }
  local_298 = paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1a8,pcVar14,lVar10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1a8," values",7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
  std::ios_base::~ios_base(local_138);
  uVar11 = (this->super_DefaultFBOMultisampleCase).m_numSamples * 4;
  if (0 < (int)uVar11) {
    fVar21 = (float)(int)uVar11;
    local_284 = (float)(int)(uVar11 * uVar11 + -1);
    uVar16 = 0;
    local_290 = &this->super_DefaultFBOMultisampleCase;
    local_218 = (ulong)uVar11;
    do {
      iVar3 = (int)uVar16;
      fVar23 = (float)iVar3 / fVar21;
      local_288 = iVar3 + 1;
      fVar23 = fVar23 + fVar23 + -1.0;
      fVar24 = (float)(int)local_288 / fVar21 + (float)(int)local_288 / fVar21 + -1.0;
      local_280 = (float)iVar3 / (float)(int)(uVar11 - 1);
      local_1c0 = (ulong)(uint)(iVar3 * (int)local_218);
      uVar12 = 0;
      local_1b8 = uVar16;
      do {
        uVar5 = uVar12 + 1;
        local_1b0 = (undefined1  [8])0x3f80000000000000;
        pp_Stack_1a8 = (_func_int **)0x0;
        local_210._M_dataplus._M_p = (pointer)0x3f800000;
        local_210._M_string_length = 0;
        bVar20 = (this->super_DefaultFBOMultisampleCase).field_0xb1 != '\0';
        if (bVar20) {
          local_278._12_4_ = (float)(int)uVar12 / (float)(int)(uVar11 - 1);
        }
        else {
          local_278._12_4_ = 1.0;
        }
        local_278._0_8_ = (pointer)0x0;
        local_278._8_4_ = 0;
        local_258[3] = local_280;
        if (!bVar20) {
          local_258[3] = 1.0;
        }
        local_258[0] = 0.0;
        local_258[1] = 0.0;
        local_258[2] = 0.0;
        if ((this->super_DefaultFBOMultisampleCase).field_0xb2 == '\x01') {
          fVar22 = (float)(int)((int)local_1c0 + uVar12) / local_284;
          if ((this->super_DefaultFBOMultisampleCase).field_0xb3 != '\0') {
            fVar22 = 1.0 - fVar22;
          }
          (**(code **)(lVar8 + 0x1250))(fVar22);
          dVar4 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar4,"glSampleCoverage",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                          ,0x32f);
        }
        if ((this->super_DefaultFBOMultisampleCase).field_0xb4 == '\x01') {
          iVar3 = local_290->m_numSamples;
          uVar6 = iVar3 + 0x1e;
          if (-1 < (int)(iVar3 - 1U)) {
            uVar6 = iVar3 - 1U;
          }
          iVar3 = iVar3 - (uVar6 & 0xffffffe0);
          iVar17 = (int)uVar6 >> 5;
          iVar15 = -1;
          if (-1 < iVar17) {
            iVar15 = iVar17;
          }
          for (iVar19 = 0; iVar15 + 1 != iVar19; iVar19 = iVar19 + 1) {
            uVar6 = uVar12 << ((byte)((uint)(local_290->m_numSamples -
                                            (local_290->m_numSamples >> 0x1f)) >> 1) & 0x1f) ^
                    (uint)local_1b8;
            uVar6 = (uVar6 >> 0x10 ^ uVar6 ^ 0x3d) * 9;
            uVar7 = (uVar6 >> 4 ^ uVar6) * 0x27d4eb2d;
            uVar6 = 0xffffffff;
            if (iVar17 == iVar19) {
              uVar6 = ~(-1 << ((byte)iVar3 & 0x1f));
            }
            if (0x1f < iVar3) {
              uVar6 = 0xffffffff;
            }
            (**(code **)(lVar8 + 0x1258))(iVar19,uVar6 & (uVar7 >> 0xf ^ uVar7));
            dVar4 = (**(code **)(lVar8 + 0x800))();
            glu::checkError(dVar4,"glSampleMaski",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                            ,0x33f);
          }
        }
        this = (MaskConstancyCase *)local_290;
        fVar22 = (float)(int)uVar12 / fVar21;
        fVar22 = fVar22 + fVar22 + -1.0;
        local_2b8.m_data[0] = (float)(int)uVar5 / fVar21 + (float)(int)uVar5 / fVar21 + -1.0;
        local_228.m_data[0] = 0.0;
        local_228.m_data[1] = 0.0;
        local_228.m_data[2] = 0.0;
        local_228.m_data[3] = 0.0;
        lVar10 = 0;
        do {
          local_228.m_data[lVar10] =
               *(float *)(local_1b0 + lVar10 * 4) + *(float *)(local_278 + lVar10 * 4);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
        local_238.m_data[0] = 0.0;
        local_238.m_data[1] = 0.0;
        local_238.m_data[2] = 0.0;
        local_238.m_data[3] = 0.0;
        lVar10 = 0;
        do {
          local_238.m_data[lVar10] = *(float *)(local_1b0 + lVar10 * 4) + local_258[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
        local_1d8.m_data[0] = 0.0;
        local_1d8.m_data[1] = 0.0;
        local_1d8.m_data[2] = 0.0;
        local_1d8.m_data[3] = 0.0;
        lVar10 = 0;
        do {
          local_1d8.m_data[lVar10] =
               *(float *)(local_1b0 + lVar10 * 4) + *(float *)(local_278 + lVar10 * 4);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
        local_248.m_data[0] = 0.0;
        local_248.m_data[1] = 0.0;
        local_248.m_data[2] = 0.0;
        local_248.m_data[3] = 0.0;
        lVar10 = 0;
        do {
          local_248.m_data[lVar10] = *(float *)(local_1b0 + lVar10 * 4) + local_258[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
        local_2b8.m_data[1] = fVar24;
        local_2b0.m_data[0] = fVar22;
        local_2b0.m_data[1] = fVar24;
        local_2a8.m_data[0] = local_2b8.m_data[0];
        local_2a8.m_data[1] = fVar23;
        local_2a0.m_data[0] = fVar22;
        local_2a0.m_data[1] = fVar23;
        local_27c = local_2b8.m_data[0];
        DefaultFBOMultisampleCase::renderTriangle
                  (local_290,&local_2a0,&local_2a8,&local_2b0,&local_228,&local_238,&local_1d8);
        DefaultFBOMultisampleCase::renderTriangle
                  (&this->super_DefaultFBOMultisampleCase,&local_2b0,&local_2a8,&local_2b8,
                   &local_1d8,&local_238,&local_248);
        local_2a8.m_data[0] = local_27c;
        local_2b8.m_data[0] = local_27c;
        local_228.m_data[0] = 0.0;
        local_228.m_data[1] = 0.0;
        local_228.m_data[2] = 0.0;
        local_228.m_data[3] = 0.0;
        lVar10 = 0;
        do {
          local_228.m_data[lVar10] =
               *(float *)((long)&local_210._M_dataplus._M_p + lVar10 * 4) +
               *(float *)(local_278 + lVar10 * 4);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
        local_238.m_data[0] = 0.0;
        local_238.m_data[1] = 0.0;
        local_238.m_data[2] = 0.0;
        local_238.m_data[3] = 0.0;
        lVar10 = 0;
        do {
          local_238.m_data[lVar10] =
               *(float *)((long)&local_210._M_dataplus._M_p + lVar10 * 4) + local_258[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
        local_1d8.m_data[0] = 0.0;
        local_1d8.m_data[1] = 0.0;
        local_1d8.m_data[2] = 0.0;
        local_1d8.m_data[3] = 0.0;
        lVar10 = 0;
        do {
          local_1d8.m_data[lVar10] =
               *(float *)((long)&local_210._M_dataplus._M_p + lVar10 * 4) +
               *(float *)(local_278 + lVar10 * 4);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
        local_248.m_data[0] = 0.0;
        local_248.m_data[1] = 0.0;
        local_248.m_data[2] = 0.0;
        local_248.m_data[3] = 0.0;
        lVar10 = 0;
        do {
          local_248.m_data[lVar10] =
               *(float *)((long)&local_210._M_dataplus._M_p + lVar10 * 4) + local_258[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
        local_2b8.m_data[1] = fVar24;
        local_2b0.m_data[0] = fVar22;
        local_2b0.m_data[1] = fVar24;
        local_2a8.m_data[1] = fVar23;
        local_2a0.m_data[0] = fVar22;
        local_2a0.m_data[1] = fVar23;
        DefaultFBOMultisampleCase::renderTriangle
                  (&this->super_DefaultFBOMultisampleCase,&local_2a0,&local_2a8,&local_2b0,
                   &local_228,&local_238,&local_1d8);
        DefaultFBOMultisampleCase::renderTriangle
                  (&this->super_DefaultFBOMultisampleCase,&local_2b0,&local_2a8,&local_2b8,
                   &local_1d8,&local_238,&local_248);
        uVar12 = uVar5;
      } while (uVar5 != (uint)local_218);
      uVar16 = (ulong)local_288;
    } while (local_288 != (uint)local_218);
  }
  DefaultFBOMultisampleCase::readImage(&this->super_DefaultFBOMultisampleCase,&local_1f0);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"RenderedImage","");
  local_278._0_8_ = &local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Rendered image","");
  surface = &local_1f0;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,&local_210,(string *)local_278,surface,
             QP_IMAGE_COMPRESSION_MODE_PNG);
  tcu::LogImage::write((LogImage *)local_1b0,(int)local_298,__buf,(size_t)surface);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if (local_1b0 != (undefined1  [8])&local_1a0) {
    operator_delete((void *)local_1b0,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._0_8_ != &local_268) {
    operator_delete((void *)local_278._0_8_,local_268._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  bVar20 = 0 < local_1f0.m_height;
  if (0 < local_1f0.m_height) {
    iVar3 = 0;
    iVar15 = 0;
    do {
      uVar16 = (ulong)(uint)local_1f0.m_width;
      iVar17 = iVar3;
      if (0 < local_1f0.m_width) {
        do {
          if (*(char *)((long)local_1f0.m_pixels.m_ptr + (long)iVar17 * 4 + 1) != '\0') {
            local_1b0 = (undefined1  [8])local_298;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1a8,
                       "Failure: Non-zero green color component detected - should have been completely overwritten by red quad"
                       ,0x66);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
            std::ios_base::~ios_base(local_138);
            tcu::TestContext::setTestResult
                      (((this->super_DefaultFBOMultisampleCase).super_TestCase.m_context)->m_testCtx
                       ,QP_TEST_RESULT_FAIL,"Failed");
            if (bVar20) goto LAB_01559263;
            goto LAB_0155917b;
          }
          iVar17 = iVar17 + 1;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
      }
      iVar15 = iVar15 + 1;
      iVar3 = iVar3 + local_1f0.m_width;
      bVar20 = iVar15 < local_1f0.m_height;
    } while (iVar15 != local_1f0.m_height);
  }
LAB_0155917b:
  local_1b0 = (undefined1  [8])local_298;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1a8,
             "Success: Coverage mask appears to be constant at a given pixel coordinate with a given "
             ,0x57);
  pbVar13 = glcts::fixed_sample_locations_values + 1;
  pbVar18 = (bool *)0x1a60f13;
  if ((ulong)(byte)(this->super_DefaultFBOMultisampleCase).field_0xb1 == 0) {
    pbVar18 = glcts::fixed_sample_locations_values + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1a8,pbVar18,
             (ulong)(byte)(this->super_DefaultFBOMultisampleCase).field_0xb1 * 5);
  bVar2 = (this->super_DefaultFBOMultisampleCase).field_0xb2 &
          (this->super_DefaultFBOMultisampleCase).field_0xb1;
  pbVar18 = (bool *)0x1c07d78;
  if (bVar2 == 0) {
    pbVar18 = glcts::fixed_sample_locations_values + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1a8,pbVar18,(ulong)bVar2 * 5);
  bVar20 = (this->super_DefaultFBOMultisampleCase).field_0xb2 != '\0';
  if (bVar20) {
    pbVar13 = (bool *)0x1c0942e;
  }
  lVar8 = 0xe;
  if (!bVar20) {
    lVar8 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1a8,pbVar13,lVar8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
  std::ios_base::~ios_base(local_138);
  tcu::TestContext::setTestResult
            (((this->super_DefaultFBOMultisampleCase).super_TestCase.m_context)->m_testCtx,
             QP_TEST_RESULT_PASS,"Passed");
LAB_01559263:
  tcu::Surface::~Surface(&local_1f0);
  return STOP;
}

Assistant:

MaskConstancyCase::IterateResult MaskConstancyCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	TestLog&				log				= m_testCtx.getLog();
	tcu::Surface			renderedImg		(m_viewportSize, m_viewportSize);

	randomizeViewport();

	log << TestLog::Message << "Clearing color to black" << TestLog::EndMessage;
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

	if (m_isAlphaToCoverageCase)
	{
		gl.enable(GL_SAMPLE_ALPHA_TO_COVERAGE);
		gl.colorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_FALSE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "enable GL_SAMPLE_ALPHA_TO_COVERAGE");

		log << TestLog::Message << "GL_SAMPLE_ALPHA_TO_COVERAGE is enabled" << TestLog::EndMessage;
		log << TestLog::Message << "Color mask is TRUE, TRUE, TRUE, FALSE" << TestLog::EndMessage;
	}

	if (m_isSampleCoverageCase)
	{
		gl.enable(GL_SAMPLE_COVERAGE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "enable GL_SAMPLE_COVERAGE");

		log << TestLog::Message << "GL_SAMPLE_COVERAGE is enabled" << TestLog::EndMessage;
	}

	if (m_isSampleMaskCase)
	{
		gl.enable(GL_SAMPLE_MASK);
		GLU_EXPECT_NO_ERROR(gl.getError(), "enable GL_SAMPLE_MASK");

		log << TestLog::Message << "GL_SAMPLE_MASK is enabled" << TestLog::EndMessage;
	}

	log << TestLog::Message
		<< "Drawing several green quads, each fully overlapped by a red quad with the same "
		<< (m_isAlphaToCoverageCase ? "alpha" : "")
		<< (m_isAlphaToCoverageCase && (m_isSampleCoverageCase || m_isSampleMaskCase) ? " and " : "")
		<< (m_isInvertedSampleCoverageCase ? "inverted " : "")
		<< (m_isSampleCoverageCase ? "sample coverage" : "")
		<< (m_isSampleCoverageCase && m_isSampleMaskCase ? " and " : "")
		<< (m_isSampleMaskCase ? "sample mask" : "")
		<< " values"
		<< TestLog::EndMessage;

	const int numQuadRowsCols = m_numSamples*4;

	for (int row = 0; row < numQuadRowsCols; row++)
	{
		for (int col = 0; col < numQuadRowsCols; col++)
		{
			float		x0			= (float)(col+0) / (float)numQuadRowsCols * 2.0f - 1.0f;
			float		x1			= (float)(col+1) / (float)numQuadRowsCols * 2.0f - 1.0f;
			float		y0			= (float)(row+0) / (float)numQuadRowsCols * 2.0f - 1.0f;
			float		y1			= (float)(row+1) / (float)numQuadRowsCols * 2.0f - 1.0f;
			const Vec4	baseGreen	(0.0f, 1.0f, 0.0f, 0.0f);
			const Vec4	baseRed		(1.0f, 0.0f, 0.0f, 0.0f);
			Vec4		alpha0		(0.0f, 0.0f, 0.0f, m_isAlphaToCoverageCase ? (float)col / (float)(numQuadRowsCols-1) : 1.0f);
			Vec4		alpha1		(0.0f, 0.0f, 0.0f, m_isAlphaToCoverageCase ? (float)row / (float)(numQuadRowsCols-1) : 1.0f);

			if (m_isSampleCoverageCase)
			{
				float value = (float)(row*numQuadRowsCols + col) / (float)(numQuadRowsCols*numQuadRowsCols-1);
				gl.sampleCoverage(m_isInvertedSampleCoverageCase ? 1.0f - value : value, m_isInvertedSampleCoverageCase ? GL_TRUE : GL_FALSE);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glSampleCoverage");
			}

			if (m_isSampleMaskCase)
			{
				const int			wordCount		= getEffectiveSampleMaskWordCount(m_numSamples - 1);
				const GLbitfield	finalWordBits	= m_numSamples - 32 * ((m_numSamples-1) / 32);
				const GLbitfield	finalWordMask	= (GLbitfield)deBitMask32(0, (int)finalWordBits);

				for (int wordNdx = 0; wordNdx < wordCount; ++wordNdx)
				{
					const GLbitfield	mask		= (GLbitfield)deUint32Hash((col << (m_numSamples / 2)) ^ row);
					const bool			isFinalWord	= (wordNdx + 1) == wordCount;
					const GLbitfield	maskMask	= (isFinalWord) ? (finalWordMask) : (0xFFFFFFFFUL); // maskMask prevents setting coverage bits higher than sample count

					gl.sampleMaski(wordNdx, mask & maskMask);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glSampleMaski");
				}
			}

			renderQuad(Vec2(x0, y0), Vec2(x1, y0), Vec2(x0, y1), Vec2(x1, y1), baseGreen + alpha0,	baseGreen + alpha1,	baseGreen + alpha0,	baseGreen + alpha1);
			renderQuad(Vec2(x0, y0), Vec2(x1, y0), Vec2(x0, y1), Vec2(x1, y1), baseRed + alpha0,	baseRed + alpha1,	baseRed + alpha0,	baseRed + alpha1);
		}
	}

	readImage(renderedImg);

	log << TestLog::Image("RenderedImage", "Rendered image", renderedImg, QP_IMAGE_COMPRESSION_MODE_PNG);

	for (int y = 0; y < renderedImg.getHeight(); y++)
	for (int x = 0; x < renderedImg.getWidth(); x++)
	{
		if (renderedImg.getPixel(x, y).getGreen() > 0)
		{
			log << TestLog::Message << "Failure: Non-zero green color component detected - should have been completely overwritten by red quad" << TestLog::EndMessage;
			m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Failed");
			return STOP;
		}
	}

	log << TestLog::Message
		<< "Success: Coverage mask appears to be constant at a given pixel coordinate with a given "
		<< (m_isAlphaToCoverageCase ? "alpha" : "")
		<< (m_isAlphaToCoverageCase && m_isSampleCoverageCase ? " and " : "")
		<< (m_isSampleCoverageCase ? "coverage value" : "")
		<< TestLog::EndMessage;

	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Passed");

	return STOP;
}